

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  Options *in_RCX;
  Options local_110;
  
  __s = &local_110.dllexport_decl.field_2;
  memset(__s,0,0xe0);
  local_110.dllexport_decl._M_string_length = 0;
  local_110.safe_boundary_check = false;
  local_110.transitive_pb_h = true;
  local_110.annotate_headers = false;
  local_110.enforce_mode = kNoEnforcement;
  local_110.table_driven_parsing = false;
  local_110.table_driven_serialization = false;
  local_110.lite_implicit_weak_fields = false;
  local_110.bootstrap = false;
  local_110.opensource_runtime = false;
  local_110.annotate_accessor = false;
  local_110.unused_field_stripping = false;
  local_110.profile_driven_inline_string = true;
  local_110.runtime_include_base._M_dataplus._M_p = (pointer)&local_110.runtime_include_base.field_2
  ;
  local_110.runtime_include_base.field_2._M_local_buf[0] = '\0';
  local_110.annotation_pragma_name._M_dataplus._M_p =
       (pointer)&local_110.annotation_pragma_name.field_2;
  local_110.annotation_pragma_name.field_2._M_local_buf[0] = '\0';
  local_110.annotation_guard_name._M_dataplus._M_p =
       (pointer)&local_110.annotation_guard_name.field_2;
  local_110.annotation_guard_name.field_2._M_local_buf[0] = '\0';
  local_110.tctable_mode = kTCTableNever;
  local_110.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left =
       &local_110.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
        super__Rb_tree_header._M_header;
  local_110.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  local_110.eagerly_verified_lazy = false;
  local_110.dllexport_decl._M_dataplus._M_p = (pointer)__s;
  local_110.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right =
       local_110.field_listener_options.forbidden_field_listener_events._M_t._M_impl.
       super__Rb_tree_header._M_header._M_left;
  QualifiedClassName_abi_cxx11_(__return_storage_ptr__,this,(Descriptor *)&local_110,in_RCX);
  Options::~Options(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d) {
  return QualifiedClassName(d, Options());
}